

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::addDepthBuffer
          (GLFrameBuffer *this,shared_ptr<polyscope::render::RenderBuffer> *renderBufferIn)

{
  PFNGLFRAMEBUFFERRENDERBUFFERPROC p_Var1;
  bool bVar2;
  RenderBufferHandle RVar3;
  runtime_error *this_00;
  element_type *peVar4;
  socklen_t in_ECX;
  sockaddr *__addr;
  int in_ESI;
  long *in_RDI;
  undefined1 in_stack_00000047;
  shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer> renderBuffer;
  value_type *in_stack_ffffffffffffff88;
  vector<std::shared_ptr<polyscope::render::RenderBuffer>,_std::allocator<std::shared_ptr<polyscope::render::RenderBuffer>_>_>
  *this_01;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  __shared_ptr local_20 [32];
  
  std::
  dynamic_pointer_cast<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,polyscope::render::RenderBuffer>
            ((shared_ptr<polyscope::render::RenderBuffer> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  bVar2 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (!bVar2) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"tried to bind to non-GL render buffer");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar4 = std::
           __shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3dd52a);
  GLRenderBuffer::bind(peVar4,in_ESI,__addr,in_ECX);
  (**(code **)(*in_RDI + 0x10))();
  p_Var1 = glad_glFramebufferRenderbuffer;
  peVar4 = std::
           __shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3dd55d);
  RVar3 = GLRenderBuffer::getHandle(peVar4);
  (*p_Var1)(0x8d40,0x8d00,0x8d41,RVar3);
  checkGLError((bool)in_stack_00000047);
  this_01 = (vector<std::shared_ptr<polyscope::render::RenderBuffer>,_std::allocator<std::shared_ptr<polyscope::render::RenderBuffer>_>_>
             *)(in_RDI + 0xb);
  std::shared_ptr<polyscope::render::RenderBuffer>::
  shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer,void>
            ((shared_ptr<polyscope::render::RenderBuffer> *)this_01,
             (shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer> *)
             in_stack_ffffffffffffff88);
  std::
  vector<std::shared_ptr<polyscope::render::RenderBuffer>,_std::allocator<std::shared_ptr<polyscope::render::RenderBuffer>_>_>
  ::push_back(this_01,in_stack_ffffffffffffff88);
  std::shared_ptr<polyscope::render::RenderBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::RenderBuffer> *)0x3dd5d0);
  std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::backend_openGL3_glfw::GLRenderBuffer> *)0x3dd5da);
  return;
}

Assistant:

void GLFrameBuffer::addDepthBuffer(std::shared_ptr<RenderBuffer> renderBufferIn) {
  // it _better_ be a GL buffer
  std::shared_ptr<GLRenderBuffer> renderBuffer = std::dynamic_pointer_cast<GLRenderBuffer>(renderBufferIn);
  if (!renderBuffer) throw std::runtime_error("tried to bind to non-GL render buffer");

  renderBuffer->bind();
  bind();

  // Sanity checks
  // if (depthRenderBuffer != nullptr) throw std::runtime_error("OpenGL error: already bound to render buffer");
  // if (depthTextureBuffer != nullptr) throw std::runtime_error("OpenGL error: already bound to texture buffer");

  glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, renderBuffer->getHandle());
  checkGLError();
  renderBuffersDepth.push_back(renderBuffer);
}